

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

bool __thiscall duckdb::Binder::HasActiveBinder(Binder *this)

{
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> *pvVar1;
  
  pvVar1 = GetActiveBinders(this);
  return (pvVar1->
         super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
         ).
         super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pvVar1->
         super_vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
         ).
         super__Vector_base<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool Binder::HasActiveBinder() {
	return !GetActiveBinders().empty();
}